

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall
crnlib::dynamic_string::set(dynamic_string *this,dynamic_string *other,uint max_len)

{
  char *__dest;
  bool bVar1;
  uint len_00;
  char *__src;
  uint len;
  uint max_len_local;
  dynamic_string *other_local;
  dynamic_string *this_local;
  
  if (this == other) {
    if (max_len < this->m_len) {
      this->m_pStr[max_len] = '\0';
      this->m_len = (uint16)max_len;
    }
  }
  else {
    len_00 = math::minimum<unsigned_int>(max_len,(uint)other->m_len);
    if (len_00 == 0) {
      clear(this);
    }
    else {
      bVar1 = ensure_buf(this,len_00,false);
      if (bVar1) {
        this->m_len = (uint16)len_00;
        __dest = this->m_pStr;
        __src = get_ptr_priv(other);
        memcpy(__dest,__src,(ulong)this->m_len);
        this->m_pStr[len_00] = '\0';
      }
    }
  }
  check(this);
  return this;
}

Assistant:

dynamic_string& dynamic_string::set(const dynamic_string& other, uint max_len)
    {
        if (this == &other)
        {
            if (max_len < m_len)
            {
                m_pStr[max_len] = '\0';
                m_len = static_cast<uint16>(max_len);
            }
        }
        else
        {
            const uint len = math::minimum<uint>(max_len, other.m_len);

            if (!len)
            {
                clear();
            }
            else if (ensure_buf(len, false))
            {
                m_len = static_cast<uint16>(len);
                memcpy(m_pStr, other.get_ptr_priv(), m_len);
                m_pStr[len] = '\0';
            }
        }

        check();

        return *this;
    }